

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::ResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ResultBuilder *this)

{
  string *__lhs;
  string *__lhs_00;
  string *__rhs;
  pointer pcVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  ulong *puVar7;
  long *plVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  
  __lhs = &(this->m_exprComponents).op;
  iVar2 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar2 == 0) {
    if ((this->m_exprComponents).lhs._M_string_length != 0) {
      std::operator+(__return_storage_ptr__,__lhs,&(this->m_exprComponents).lhs);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->m_assertionInfo).capturedExpression._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->m_assertionInfo).capturedExpression._M_string_length);
    return __return_storage_ptr__;
  }
  iVar2 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar2 == 0) {
    pcVar1 = (this->m_exprComponents).lhs._M_dataplus._M_p;
    __str.field_2._8_8_ = &__str_1._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(__str.field_2._M_local_buf + 8),pcVar1,
               pcVar1 + (this->m_exprComponents).lhs._M_string_length);
    std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               (__str.field_2._M_local_buf + 8,
                                (ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_130.field_2._M_allocated_capacity = __str_1._M_string_length;
    local_130._M_dataplus._M_p = (pointer)__str.field_2._8_8_;
    if ((size_type *)__str.field_2._8_8_ == &__str_1._M_string_length) {
      return __return_storage_ptr__;
    }
    goto LAB_001448c7;
  }
  iVar2 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar2 != 0) {
    if ((this->m_exprComponents).rhs._M_string_length +
        (this->m_exprComponents).lhs._M_string_length < 0x28) {
      __lhs_00 = &(this->m_exprComponents).lhs;
      lVar3 = std::__cxx11::string::find((char *)__lhs_00,0x18eb18,0);
      if (lVar3 == -1) {
        __rhs = &(this->m_exprComponents).rhs;
        lVar3 = std::__cxx11::string::find((char *)__rhs,0x18eb18,0);
        if (lVar3 == -1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,__lhs_00," ");
          std::operator+(&local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,__lhs);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
          psVar6 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar6) {
            __str_1._M_string_length = *psVar6;
            __str_1.field_2._M_allocated_capacity = plVar4[3];
            __str.field_2._8_8_ = &__str_1._M_string_length;
          }
          else {
            __str_1._M_string_length = *psVar6;
            __str.field_2._8_8_ = (size_type *)*plVar4;
          }
          __str_1._M_dataplus._M_p = (pointer)plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&__str.field_2 + 8),__rhs);
          if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
            operator_delete((void *)__str.field_2._8_8_,__str_1._M_string_length + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          local_130.field_2._M_allocated_capacity = __str._M_string_length;
          local_130._M_dataplus._M_p = (pointer)local_70;
          if (local_70 == (undefined1  [8])&__str._M_string_length) {
            return __return_storage_ptr__;
          }
          goto LAB_001448c7;
        }
      }
    }
    pcVar1 = (this->m_exprComponents).lhs._M_dataplus._M_p;
    local_70 = (undefined1  [8])&__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + (this->m_exprComponents).lhs._M_string_length);
    std::__cxx11::string::append((char *)local_70);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               (local_70,(ulong)(this->m_exprComponents).op._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90.field_2._8_8_ = plVar4[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_90._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      __str_1._M_string_length = *psVar6;
      __str_1.field_2._M_allocated_capacity = plVar4[3];
      __str.field_2._8_8_ = &__str_1._M_string_length;
    }
    else {
      __str_1._M_string_length = *psVar6;
      __str.field_2._8_8_ = (size_type *)*plVar4;
    }
    __str_1._M_dataplus._M_p = (pointer)plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               (__str.field_2._M_local_buf + 8,
                                (ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_,__str_1._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_130.field_2._M_allocated_capacity = __str._M_string_length;
    local_130._M_dataplus._M_p = (pointer)local_70;
    if (local_70 == (undefined1  [8])&__str._M_string_length) {
      return __return_storage_ptr__;
    }
    goto LAB_001448c7;
  }
  std::operator+(&local_130,"{can\'t expand - use ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_c0 = *puVar7;
    lStack_b8 = plVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar7;
    local_d0 = (ulong *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_f0,(ulong)&(this->m_assertionInfo).capturedExpression);
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0;
  }
  if (uVar9 < (ulong)(local_e8 + local_c8)) {
    uVar9 = 0xf;
    if (local_f0 != local_e0) {
      uVar9 = local_e0[0];
    }
    if (uVar9 < (ulong)(local_e8 + local_c8)) goto LAB_001445d2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_001445d2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
  }
  local_b0 = &local_a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_a0 = *plVar4;
    uStack_98 = puVar5[3];
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*puVar5;
  }
  local_a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_110 = &local_100;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_100 = *plVar8;
    lStack_f8 = plVar4[3];
  }
  else {
    local_100 = *plVar8;
    local_110 = (long *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,
                              (ulong)(this->m_assertionInfo).macroName._M_dataplus._M_p);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    __str._M_string_length = *psVar6;
    __str.field_2._M_allocated_capacity = plVar4[3];
    local_70 = (undefined1  [8])&__str._M_string_length;
  }
  else {
    __str._M_string_length = *psVar6;
    local_70 = (undefined1  [8])*plVar4;
  }
  __str._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_70);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar4[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,
                              (ulong)(this->m_assertionInfo).capturedExpression._M_dataplus._M_p);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    __str_1._M_string_length = *psVar6;
    __str_1.field_2._M_allocated_capacity = plVar4[3];
    __str.field_2._8_8_ = &__str_1._M_string_length;
  }
  else {
    __str_1._M_string_length = *psVar6;
    __str.field_2._8_8_ = (size_type *)*plVar4;
  }
  __str_1._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
    operator_delete((void *)__str.field_2._8_8_,__str_1._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_70,__str._M_string_length + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p == &local_130.field_2) {
    return __return_storage_ptr__;
  }
LAB_001448c7:
  operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string ResultBuilder::reconstructExpression() const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? m_assertionInfo.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
                m_exprComponents.lhs.find("\n") == std::string::npos &&
                m_exprComponents.rhs.find("\n") == std::string::npos )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else
                return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
        }
        else
            return "{can't expand - use " + m_assertionInfo.macroName + "_FALSE( " + m_assertionInfo.capturedExpression.substr(1) + " ) instead of " + m_assertionInfo.macroName + "( " + m_assertionInfo.capturedExpression + " ) for better diagnostics}";
    }